

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O2

void __thiscall
cpptrace::stacktrace::print
          (stacktrace *this,ostream *stream,bool color,bool newline_at_end,char *header)

{
  pointer psVar1;
  uint frame_number_width;
  int *piVar2;
  ostream *poVar3;
  undefined7 in_register_00000011;
  char *pcVar4;
  stacktrace_frame *frame;
  pointer psVar5;
  size_t counter;
  
  if ((int)CONCAT71(in_register_00000011,color) != 0) {
    if (stream == (ostream *)&std::cout) {
      piVar2 = &stdout_fileno;
    }
    else {
      if (stream != (ostream *)&std::cerr) goto LAB_0018c8dc;
      piVar2 = &stderr_fileno;
    }
    detail::isatty(*piVar2);
  }
LAB_0018c8dc:
  pcVar4 = "Stack trace (most recent call first):";
  if (header != (char *)0x0) {
    pcVar4 = header;
  }
  poVar3 = std::operator<<(stream,pcVar4);
  std::operator<<(poVar3,'\n');
  psVar5 = (this->frames).
           super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->frames).
           super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar1) {
    frame_number_width = detail::n_digits((int)(((long)psVar1 - (long)psVar5) / 0x60) - 1);
    psVar1 = (this->frames).
             super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    counter = 0;
    for (psVar5 = (this->frames).
                  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1)
    {
      print_frame(stream,color,frame_number_width,counter,psVar5);
      if ((newline_at_end) ||
         (psVar5 != (this->frames).
                    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1)) {
        std::operator<<(stream,'\n');
      }
      counter = counter + 1;
    }
    return;
  }
  std::operator<<(stream,"<empty trace>\n");
  return;
}

Assistant:

void stacktrace::print(std::ostream& stream, bool color, bool newline_at_end, const char* header) const {
        if(
            color && (
                (&stream == &std::cout && isatty(stdout_fileno)) || (&stream == &std::cerr && isatty(stderr_fileno))
            )
        ) {
            detail::enable_virtual_terminal_processing_if_needed();
        }
        stream << (header ? header : "Stack trace (most recent call first):") << '\n';
        std::size_t counter = 0;
        if(frames.empty()) {
            stream << "<empty trace>\n";
            return;
        }
        const auto frame_number_width = detail::n_digits(static_cast<int>(frames.size()) - 1);
        for(const auto& frame : frames) {
            print_frame(stream, color, frame_number_width, counter, frame);
            if(newline_at_end || &frame != &frames.back()) {
                stream << '\n';
            }
            counter++;
        }
    }